

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 *puVar5;
  long *plVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 extraout_var;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  
  if (this->nAlloc < n) {
    pmVar3 = (this->alloc).memoryResource;
    iVar8 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 5,8);
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var,iVar8);
    if (this->nStored != 0) {
      lVar11 = 0x10;
      uVar12 = 0;
      do {
        pbVar4 = this->ptr;
        puVar1 = (undefined8 *)((long)&(pbVar9->_M_dataplus)._M_p + lVar11);
        *(undefined8 **)((long)pbVar9 + lVar11 + -0x10) = puVar1;
        puVar5 = *(undefined8 **)((long)pbVar4 + lVar11 + -0x10);
        puVar2 = (undefined8 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar11);
        if (puVar2 == puVar5) {
          uVar7 = puVar2[1];
          *puVar1 = *puVar2;
          puVar1[1] = uVar7;
        }
        else {
          *(undefined8 **)((long)pbVar9 + lVar11 + -0x10) = puVar5;
          *(undefined8 *)((long)&(pbVar9->_M_dataplus)._M_p + lVar11) = *puVar2;
        }
        *(undefined8 *)((long)pbVar9 + lVar11 + -8) = *(undefined8 *)((long)pbVar4 + lVar11 + -8);
        *(undefined8 **)((long)pbVar4 + lVar11 + -0x10) = puVar2;
        *(undefined8 *)((long)pbVar4 + lVar11 + -8) = 0;
        *(undefined1 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar11) = 0;
        plVar6 = *(long **)((long)this->ptr + lVar11 + -0x10);
        plVar10 = (long *)((long)&(this->ptr->_M_dataplus)._M_p + lVar11);
        if (plVar10 != plVar6) {
          operator_delete(plVar6,*plVar10 + 1);
        }
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar12 < this->nStored);
    }
    pmVar3 = (this->alloc).memoryResource;
    (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 5,8);
    this->nAlloc = n;
    this->ptr = pbVar9;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }